

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagsValidatorDeathTest_InvalidFlagNeverSet::Run(void)

{
  bool bVar1;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidatorDeathTest","InvalidFlagNeverSet");
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  if (bVar1) {
    g_called_exit = '\0';
    gflags_exitfunc = CalledExit;
    ParseTestFlag(true,1,&PTR_anon_var_dwarf_1d5bf_00155d60);
    gflags_exitfunc = exit;
    if (g_called_exit != '\0') {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    fprintf(_stderr,"Function didn\'t die (%s): %s\n",
            "ERROR: --test_flag must be set on the commandline",
            "ParseTestFlag(true, arraysize(argv) - 1, argv)");
  }
  else {
    fprintf(_stderr,"Check failed: %s\n",
            "RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5)");
  }
  exit(1);
}

Assistant:

TEST(FlagsValidatorDeathTest, InvalidFlagNeverSet) {
  // If a flag keeps its default value, and that default value is
  // invalid, we should die at argv-parse time.
  const char* argv[] = {
    "my_test",
    NULL,
  };
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  EXPECT_DEATH(ParseTestFlag(true, arraysize(argv) - 1, argv),
               "ERROR: --test_flag must be set on the commandline");
}